

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O0

bool __thiscall kj::CidrRange::matchesFamily(CidrRange *this,int family)

{
  int family_local;
  CidrRange *this_local;
  
  if (family == 2) {
    this_local._7_1_ = this->family == 2;
  }
  else if (family == 10) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CidrRange::matchesFamily(int family) const {
  switch (family) {
    case AF_INET:
      return this->family == AF_INET;
    case AF_INET6:
      // Even if we're a v4 CIDR, we can match v6 addresses in the v4-mapped range.
      return true;
    default:
      return false;
  }
}